

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O0

bool __thiscall Pig::getDecimal(Pig *this,string *result)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  bool local_52;
  bool local_51;
  string local_48 [32];
  size_type local_28;
  size_type i;
  string *result_local;
  Pig *this_local;
  
  local_28 = this->_cursor;
  i = (size_type)result;
  result_local = (string *)this;
  peVar2 = std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
  if (*pcVar3 != '\0') {
    peVar2 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
    if (*pcVar3 != '-') {
      peVar2 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
      if (*pcVar3 != '+') goto LAB_001c0a1c;
    }
    local_28 = local_28 + 1;
  }
LAB_001c0a1c:
  peVar2 = std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
  if (*pcVar3 != '\0') {
    peVar2 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
    bVar1 = unicodeLatinDigit((int)*pcVar3);
    if (bVar1) {
      do {
        local_28 = local_28 + 1;
        peVar2 = std::
                 __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
        local_51 = false;
        if (*pcVar3 != '\0') {
          peVar2 = std::
                   __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
          local_51 = unicodeLatinDigit((int)*pcVar3);
        }
      } while (local_51 != false);
      peVar2 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
      if (*pcVar3 != '\0') {
        peVar2 = std::
                 __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
        if (*pcVar3 == '.') {
          do {
            local_28 = local_28 + 1;
            peVar2 = std::
                     __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
            local_52 = false;
            if (*pcVar3 != '\0') {
              peVar2 = std::
                       __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this);
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
              local_52 = unicodeLatinDigit((int)*pcVar3);
            }
          } while (local_52 != false);
        }
      }
      peVar2 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::substr((ulong)local_48,(ulong)peVar2);
      std::__cxx11::string::operator=((string *)i,local_48);
      std::__cxx11::string::~string(local_48);
      this->_cursor = local_28;
      return true;
    }
  }
  return false;
}

Assistant:

bool Pig::getDecimal (std::string& result)
{
  auto i = _cursor;

  // [+-]?
  if ((*_text)[i] &&
      ((*_text)[i] == '-' ||
       (*_text)[i] == '+'))
    ++i;

  // digit+
  if ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
  {
    ++i;

    while ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
      ++i;

    // ( . digit+ )?
    if ((*_text)[i] && (*_text)[i] == '.')
    {
      ++i;

      while ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
        ++i;
    }

    result = _text->substr (_cursor, i - _cursor);
    _cursor = i;
    return true;
  }

  return false;
}